

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools_sound_envs.cxx
# Opt level: O1

void __thiscall level_tools::reconstruct_sound_envs(level_tools *this)

{
  cf_vertex_vec *verts;
  float fVar1;
  float fVar2;
  uint uVar3;
  xr_level_snd_env *pxVar4;
  pointer pcVar5;
  pointer pcVar6;
  char *pcVar7;
  bool bVar8;
  char *pcVar9;
  long lVar10;
  long lVar11;
  void *__s;
  ulong uVar12;
  temp_box *ptVar13;
  xr_scene_sound_envs *pxVar14;
  xr_sound_env_object *this_00;
  long lVar15;
  cf_face *face;
  xr_custom_object_vec *this_01;
  ulong uVar16;
  ulong uVar17;
  pointer pptVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  xr_name_gen name;
  vector<unsigned_int,_std::allocator<unsigned_int>_> adjacents;
  vector<temp_box_*,_std::allocator<temp_box_*>_> boxes;
  xr_name_gen local_98;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_88;
  level_tools *local_68;
  cf_face *local_60;
  vector<temp_box_*,_std::allocator<temp_box_*>_> local_58;
  xr_sound_env_object *local_38;
  
  pxVar4 = this->m_level->m_snd_env;
  if (pxVar4 != (xr_level_snd_env *)0x0) {
    local_68 = this;
    xray_re::msg("building %s","sound_env.part");
    local_58.super__Vector_base<temp_box_*,_std::allocator<temp_box_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.super__Vector_base<temp_box_*,_std::allocator<temp_box_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.super__Vector_base<temp_box_*,_std::allocator<temp_box_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<temp_box_*,_std::allocator<temp_box_*>_>::reserve
              (&local_58,
               (ulong)(((long)(pxVar4->super_xr_cform).m_faces.
                              super__Vector_base<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pxVar4->super_xr_cform).m_faces.
                              super__Vector_base<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 2) * 0x6db6db6db6db6db7)
               / 0xc);
    local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (uint *)0x0;
    local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (uint *)0x0;
    local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&local_88,0xc);
    lVar11 = (long)(pxVar4->super_xr_cform).m_faces.
                   super__Vector_base<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(pxVar4->super_xr_cform).m_faces.
                   super__Vector_base<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2;
    __s = operator_new__(-(ulong)((ulong)(lVar11 * 0x6db6db6db6db6db7) >> 0x3e != 0) |
                         lVar11 * -0x4924924924924924);
    pcVar5 = (pxVar4->super_xr_cform).m_faces.
             super__Vector_base<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>._M_impl.
             super__Vector_impl_data._M_start;
    pcVar6 = (pxVar4->super_xr_cform).m_faces.
             super__Vector_base<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>._M_impl.
             super__Vector_impl_data._M_finish;
    lVar11 = (long)pcVar6 - (long)pcVar5 >> 2;
    uVar12 = lVar11 * 0x6db6db6db6db6db7;
    if (pcVar6 != pcVar5) {
      memset(__s,0xff,lVar11 * -0x4924924924924924);
      verts = &(pxVar4->super_xr_cform).m_vertices;
      do {
        lVar11 = uVar12 * 4;
        uVar12 = uVar12 - 1;
        if (*(int *)((long)__s + lVar11 + -4) == -1) {
          uVar17 = uVar12 & 0xffffffff;
          bVar8 = true;
          do {
            face = (pxVar4->super_xr_cform).m_faces.
                   super__Vector_base<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar17;
            if (bVar8) {
              ptVar13 = (temp_box *)operator_new(0x4c);
              temp_box::temp_box(ptVar13,face,verts);
              local_98.m_name = (char *)ptVar13;
              std::vector<temp_box*,std::allocator<temp_box*>>::emplace_back<temp_box*>
                        ((vector<temp_box*,std::allocator<temp_box*>> *)&local_58,
                         (temp_box **)&local_98);
              bVar8 = false;
            }
            else {
              temp_box::collect(local_58.super__Vector_base<temp_box_*,_std::allocator<temp_box_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish[-1],face,verts);
            }
            *(undefined4 *)((long)__s + uVar17 * 4) = 0;
            lVar11 = 3;
            local_60 = face;
            do {
              uVar3 = *(uint *)((long)local_60 + lVar11 * 4 + -4);
              lVar11 = lVar11 + -1;
              uVar16 = (ulong)(verts->
                              super__Vector_base<xray_re::cf_vertex,_std::allocator<xray_re::cf_vertex>_>
                              )._M_impl.super__Vector_impl_data._M_start[uVar3].face0;
              while (uVar16 != 0xffffffff) {
                if ((uVar16 != uVar17) && (*(int *)((long)__s + uVar16 * 4) == -1)) {
                  local_98.m_name = (char *)CONCAT44(local_98.m_name._4_4_,(uint)uVar16);
                  if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish ==
                      local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                    _M_realloc_insert<unsigned_int>
                              (&local_88,
                               (iterator)
                               local_88.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_98);
                  }
                  else {
                    *local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish = (uint)uVar16;
                    local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_finish =
                         local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish + 1;
                  }
                  *(undefined4 *)((long)__s + uVar16 * 4) = 0xffffffff;
                }
                pcVar5 = (pxVar4->super_xr_cform).m_faces.
                         super__Vector_base<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>.
                         _M_impl.super__Vector_impl_data._M_start;
                lVar10 = 3;
                do {
                  lVar15 = lVar10;
                  if (lVar15 == 0) goto LAB_00136f61;
                  lVar10 = lVar15 + -1;
                } while (*(uint *)((long)pcVar5 + (lVar15 + -1) * 4 + uVar16 * 0x1c) != uVar3);
                uVar16 = (ulong)*(uint *)((long)&pcVar5[uVar16].field_0 + lVar15 * 4 + 8);
LAB_00136f61:
                if (lVar15 == 0) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/./xr_cform.h"
                                ,0x65,
                                "uint_fast32_t xray_re::cf_face::next_face_idx(uint_fast32_t) const"
                               );
                }
              }
            } while (lVar11 != 0);
            if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start ==
                local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish) break;
            uVar17 = (ulong)local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_finish[-1];
            local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + -1;
          } while( true );
        }
      } while (uVar12 != 0);
    }
    operator_delete__(__s);
    pxVar14 = xray_re::xr_scene::sound_envs(local_68->m_scene);
    this_01 = &(pxVar14->super_xr_scene_objects).m_objects;
    std::vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>::reserve
              (this_01,(long)local_58.super__Vector_base<temp_box_*,_std::allocator<temp_box_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_58.super__Vector_base<temp_box_*,_std::allocator<temp_box_*>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3);
    xray_re::xr_name_gen::init(&local_98,(EVP_PKEY_CTX *)"sound_env");
    local_60 = (cf_face *)
               local_58.super__Vector_base<temp_box_*,_std::allocator<temp_box_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
    for (pptVar18 = local_58.super__Vector_base<temp_box_*,_std::allocator<temp_box_*>_>._M_impl.
                    super__Vector_impl_data._M_start; (cf_face *)pptVar18 != local_60;
        pptVar18 = pptVar18 + 1) {
      ptVar13 = *pptVar18;
      this_00 = (xr_sound_env_object *)operator_new(200);
      xray_re::xr_sound_env_object::xr_sound_env_object(this_00,local_68->m_scene);
      pcVar9 = local_98.m_name;
      pcVar7 = (char *)(this_00->super_xr_shape_object).super_xr_custom_object.m_name.
                       _M_string_length;
      strlen(local_98.m_name);
      std::__cxx11::string::_M_replace
                ((ulong)&(this_00->super_xr_shape_object).super_xr_custom_object.m_name,0,pcVar7,
                 (ulong)pcVar9);
      (this_00->super_xr_shape_object).super_xr_custom_object.m_position.field_0.field_0.z =
           (ptVar13->xform).field_0.field_0._43;
      *(undefined8 *)&(this_00->super_xr_shape_object).super_xr_custom_object.m_position.field_0 =
           *(undefined8 *)((long)&(ptVar13->xform).field_0 + 0x30);
      fVar19 = (ptVar13->xform).field_0.field_0._11;
      fVar20 = (ptVar13->xform).field_0.field_0._12;
      fVar21 = (ptVar13->xform).field_0.field_0._13;
      fVar19 = fVar21 * fVar21 + fVar19 * fVar19 + fVar20 * fVar20;
      if (fVar19 < 0.0) {
        fVar19 = sqrtf(fVar19);
      }
      else {
        fVar19 = SQRT(fVar19);
      }
      fVar20 = (ptVar13->xform).field_0.field_0._12;
      (ptVar13->xform).field_0.field_0._11 = (ptVar13->xform).field_0.field_0._11 / fVar19;
      (ptVar13->xform).field_0.field_0._12 = fVar20 / fVar19;
      (ptVar13->xform).field_0.field_0._13 = (ptVar13->xform).field_0.field_0._13 / fVar19;
      fVar20 = (ptVar13->xform).field_0.field_0._21;
      fVar21 = (ptVar13->xform).field_0.field_0._22;
      fVar1 = (ptVar13->xform).field_0.field_0._23;
      fVar20 = fVar1 * fVar1 + fVar20 * fVar20 + fVar21 * fVar21;
      if (fVar20 < 0.0) {
        fVar20 = sqrtf(fVar20);
      }
      else {
        fVar20 = SQRT(fVar20);
      }
      fVar21 = (ptVar13->xform).field_0.field_0._22;
      (ptVar13->xform).field_0.field_0._21 = (ptVar13->xform).field_0.field_0._21 / fVar20;
      (ptVar13->xform).field_0.field_0._22 = fVar21 / fVar20;
      (ptVar13->xform).field_0.field_0._23 = (ptVar13->xform).field_0.field_0._23 / fVar20;
      fVar21 = (ptVar13->xform).field_0.field_0._31;
      fVar1 = (ptVar13->xform).field_0.field_0._32;
      fVar2 = (ptVar13->xform).field_0.field_0._33;
      fVar21 = fVar2 * fVar2 + fVar21 * fVar21 + fVar1 * fVar1;
      if (fVar21 < 0.0) {
        fVar21 = sqrtf(fVar21);
      }
      else {
        fVar21 = SQRT(fVar21);
      }
      fVar1 = (ptVar13->xform).field_0.field_0._32;
      (ptVar13->xform).field_0.field_0._31 = (ptVar13->xform).field_0.field_0._31 / fVar21;
      (ptVar13->xform).field_0.field_0._32 = fVar1 / fVar21;
      (ptVar13->xform).field_0.field_0._33 = (ptVar13->xform).field_0.field_0._33 / fVar21;
      (this_00->super_xr_shape_object).super_xr_custom_object.m_scale.field_0.field_0.x = fVar19;
      (this_00->super_xr_shape_object).super_xr_custom_object.m_scale.field_0.field_0.y = fVar20;
      (this_00->super_xr_shape_object).super_xr_custom_object.m_scale.field_0.field_0.z = fVar21;
      xray_re::_matrix<float>::get_hpb
                (&ptVar13->xform,
                 &(this_00->super_xr_shape_object).super_xr_custom_object.m_rotation.field_0.field_0
                  .y,(float *)&(this_00->super_xr_shape_object).super_xr_custom_object.m_rotation,
                 &(this_00->super_xr_shape_object).super_xr_custom_object.m_rotation.field_0.field_0
                  .z);
      if (((ulong)((long)(pxVar4->m_env_ids).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pxVar4->m_env_ids).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5) <= (ulong)ptVar13->inner)
         || (std::__cxx11::string::_M_assign((string *)&this_00->m_inner),
            (ulong)((long)(pxVar4->m_env_ids).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pxVar4->m_env_ids).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5) <= (ulong)ptVar13->outer))
      {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      std::__cxx11::string::_M_assign((string *)&this_00->m_outer);
      operator_delete(ptVar13,0x4c);
      local_38 = this_00;
      std::vector<xray_re::xr_custom_object*,std::allocator<xray_re::xr_custom_object*>>::
      emplace_back<xray_re::xr_custom_object*>
                ((vector<xray_re::xr_custom_object*,std::allocator<xray_re::xr_custom_object*>> *)
                 this_01,(xr_custom_object **)&local_38);
      xray_re::xr_name_gen::next(&local_98);
    }
    xray_re::xr_level::clear_snd_env(local_68->m_level);
    if ((temp_box *)local_98.m_name != (temp_box *)0x0) {
      operator_delete(local_98.m_name,1);
    }
    if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (uint *)0x0) {
      operator_delete(local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_58.super__Vector_base<temp_box_*,_std::allocator<temp_box_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.super__Vector_base<temp_box_*,_std::allocator<temp_box_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_58.super__Vector_base<temp_box_*,_std::allocator<temp_box_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.super__Vector_base<temp_box_*,_std::allocator<temp_box_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void level_tools::reconstruct_sound_envs()
{
	const xr_level_snd_env* snd_env = m_level->snd_env();
	if (snd_env == 0)
		return;
	msg("building %s", "sound_env.part");

	const cf_face_vec& faces = snd_env->faces();
	const cf_vertex_vec& verts = snd_env->vertices();

	std::vector<temp_box*> boxes;
	boxes.reserve(faces.size()/12);
	std::vector<uint32_t> adjacents;
	adjacents.reserve(12);

	uint32_t* groups = new uint32_t[faces.size()];
	xr_uninitialized_fill_n(groups, faces.size(), BAD_IDX);
	uint32_t group = 0;
	for (size_t k = faces.size(); k != 0;) {
		if (groups[--k] != BAD_IDX)
			continue;
		bool new_group = true;
		for (uint_fast32_t face_idx = uint_fast32_t(k & UINT32_MAX);;) {
			const cf_face& face = faces[face_idx];
			if (new_group) {
				boxes.push_back(new temp_box(face, verts));
				new_group = false;
			} else {
				boxes.back()->collect(face, verts);
			}
			groups[face_idx] = group;
			for (uint_fast32_t i = 3; i != 0;) {
				uint32_t v = face.v[--i];
				for (uint_fast32_t next = verts[v].face0; next != BAD_IDX;) {
					if (next != face_idx && groups[next] == BAD_IDX) {
						adjacents.push_back(uint32_t(next & UINT32_MAX));
						groups[next] = BAD_IDX;
					}
					next = faces[next].next_face_idx(v);
				}
			}
			if (adjacents.empty())
				break;
			face_idx = uint32_t(adjacents.back());
			adjacents.pop_back();
		}
	}
	delete[] groups;

	xr_custom_object_vec& cobjects = m_scene->sound_envs()->objects();
	cobjects.reserve(boxes.size());

	const std::vector<std::string>& env_ids = snd_env->env_ids();

	xr_name_gen name("sound_env");
	for (std::vector<temp_box*>::iterator it = boxes.begin(), end = boxes.end();
			it != end; ++it, name.next()) {
		temp_box* box = *it;
		xr_sound_env_object* new_sound_env = new xr_sound_env_object(*m_scene);
		new_sound_env->co_name() = name.get();
		new_sound_env->co_position() = box->xform.c;
		new_sound_env->co_scale().set(box->xform.i.normalize_magn(), box->xform.j.normalize_magn(),
			box->xform.k.normalize_magn());
		box->xform.get_xyz(new_sound_env->co_rotation());
		new_sound_env->inner() = env_ids.at(box->inner);
		new_sound_env->outer() = env_ids.at(box->outer);
		delete box;
		cobjects.push_back(new_sound_env);
	}
	m_level->clear_snd_env();
}